

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefSite.h
# Opt level: O1

DefSiteSet * __thiscall
dg::dda::DefSiteSet::intersect(DefSiteSet *__return_storage_ptr__,DefSiteSet *this,DefSiteSet *rhs)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  undefined8 uVar5;
  _List_node_base *p_Var6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  _Link_type p_Var9;
  IntervalsList *pIVar10;
  _List_node_base *p_Var11;
  Offset OVar12;
  _Rb_tree_node_base *p_Var13;
  _Link_type p_Var14;
  bool bVar15;
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  lhssites;
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  rhssites;
  pair<dg::Offset,_dg::Offset> local_a8;
  _Rb_tree_node_base *local_98;
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  local_90;
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var8 = (this->
                super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 !=
      &(this->
       super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       )._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    pmVar7 = std::
             map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
             ::operator[]((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                           *)&local_90,(key_type *)(p_Var8 + 1));
    local_a8 = GenericDefSite<dg::dda::RWNode>::getInterval
                         ((GenericDefSite<dg::dda::RWNode> *)(p_Var8 + 1));
    IntervalsList::add(pmVar7,(Interval *)&local_a8);
  }
  p_Var8 = (rhs->
           super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  while (local_90._M_impl.super__Rb_tree_header._M_header._M_left = p_Var13,
        (_Rb_tree_header *)p_Var8 !=
        &(rhs->
         super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
         )._M_t._M_impl.super__Rb_tree_header) {
    pmVar7 = std::
             map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
             ::operator[]((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                           *)&local_60,(key_type *)(p_Var8 + 1));
    local_a8 = GenericDefSite<dg::dda::RWNode>::getInterval
                         ((GenericDefSite<dg::dda::RWNode> *)(p_Var8 + 1));
    IntervalsList::add(pmVar7,(Interval *)&local_a8);
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    p_Var13 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Var1 = &(__return_storage_ptr__->
            super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
            )._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = Offset::UNKNOWN;
  if ((_Rb_tree_header *)p_Var13 != &local_90._M_impl.super__Rb_tree_header) {
    uVar5 = Offset::UNKNOWN + 0xffffffffffffffff;
    do {
      p_Var8 = p_Var13 + 1;
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      p_Var9 = (_Link_type)p_Var1;
      if ((_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Link_type)0x0)
      {
        p_Var14 = (_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          bVar15 = *(RWNode **)(p_Var14->_M_storage)._M_storage < *(RWNode **)p_Var8;
          if (!bVar15) {
            p_Var9 = p_Var14;
          }
          p_Var14 = *(_Link_type *)
                     ((long)(p_Var14->_M_storage)._M_storage + ((ulong)bVar15 - 2) * 8);
        } while (p_Var14 != (_Link_type)0x0);
      }
      p_Var14 = (_Link_type)p_Var1;
      if ((p_Var9 != (_Link_type)p_Var1) &&
         (p_Var14 = p_Var9, *(RWNode **)p_Var8 < *(RWNode **)(p_Var9->_M_storage)._M_storage)) {
        p_Var14 = (_Link_type)p_Var1;
      }
      local_98 = p_Var13;
      if (p_Var14 != (_Link_type)p_Var1) {
        pIVar10 = IntervalsList::intersectWith
                            ((IntervalsList *)&p_Var13[1]._M_parent,
                             (IntervalsList *)((long)(p_Var14->_M_storage)._M_storage + 8));
        for (p_Var2 = (pIVar10->intervals).
                      super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
            p_Var2 != (_List_node_base *)pIVar10;
            p_Var2 = (((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                        *)&p_Var2->_M_next)->
                     super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                     )._M_impl._M_node.super__List_node_base._M_next) {
          p_Var3 = *(_List_node_base **)&((IntervalsList *)((long)(p_Var2 + 1) + 8))->intervals;
          p_Var11 = p_Var6;
          if (p_Var3 != p_Var6) {
            p_Var4 = *(_List_node_base **)
                      &((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                         *)(p_Var2 + 1))->
                       super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
            ;
            p_Var11 = (_List_node_base *)((long)p_Var3 - (long)p_Var4);
            if (p_Var3 < p_Var4) {
              p_Var11 = p_Var6;
            }
            if (p_Var4 == p_Var6) {
              p_Var11 = p_Var6;
            }
          }
          OVar12.offset = (type)((long)&p_Var11->_M_next + 1);
          if ((ulong)(uVar5 + 0xf) <= p_Var11) {
            OVar12.offset = (type)p_Var6;
          }
          if (p_Var11 == p_Var6) {
            OVar12.offset = (type)p_Var6;
          }
          local_a8.first.offset = OVar12.offset;
          std::
          _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
          ::_M_emplace_unique<dg::dda::RWNode*const&,dg::Offset_const&,dg::Offset>
                    ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                      *)__return_storage_ptr__,(RWNode **)p_Var8,(Offset *)(p_Var2 + 1),
                     &local_a8.first);
        }
      }
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_98);
    } while ((_Rb_tree_header *)p_Var13 != &local_90._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::_M_erase(&local_90,(_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
  return __return_storage_ptr__;
}

Assistant:

DefSiteSet intersect(const DefSiteSet &rhs) const {
        std::map<DefSite::NodeTy *, IntervalsList> lhssites;
        std::map<DefSite::NodeTy *, IntervalsList> rhssites;

        for (const auto &ds : *this) {
            lhssites[ds.target].add(ds.getInterval());
        }
        for (const auto &ds : rhs) {
            rhssites[ds.target].add(ds.getInterval());
        }

        DefSiteSet retval;

        for (auto &lit : lhssites) {
            auto rit = rhssites.find(lit.first);
            if (rit != rhssites.end()) {
                for (const auto &I : lit.second.intersectWith(rit->second)) {
                    retval.emplace(lit.first, I.start, I.length());
                }
            }
        }

        return retval;
    }